

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

iterator __thiscall llvm::yaml::Scanner::skip_b_break(Scanner *this,iterator Position)

{
  iterator Position_local;
  Scanner *this_local;
  
  this_local = (Scanner *)Position;
  if (Position != this->End) {
    if (*Position == '\r') {
      if ((Position + 1 == this->End) || (Position[1] != '\n')) {
        this_local = (Scanner *)(Position + 1);
      }
      else {
        this_local = (Scanner *)(Position + 2);
      }
    }
    else if (*Position == '\n') {
      this_local = (Scanner *)(Position + 1);
    }
  }
  return (iterator)this_local;
}

Assistant:

StringRef::iterator Scanner::skip_b_break(StringRef::iterator Position) {
  if (Position == End)
    return Position;
  if (*Position == 0x0D) {
    if (Position + 1 != End && *(Position + 1) == 0x0A)
      return Position + 2;
    return Position + 1;
  }

  if (*Position == 0x0A)
    return Position + 1;
  return Position;
}